

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

void Gia_Iso2ManPrepare(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  uint local_24;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar5 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar5 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    uVar1 = s_256Primes[0xff];
    if (!bVar5) break;
    iVar2 = Gia_ObjIsAnd(pGStack_18);
    if (iVar2 == 0) {
      local_24 = 0;
    }
    else {
      pGVar4 = Gia_ObjFanin0(pGStack_18);
      uVar1 = pGVar4->Value;
      pGVar4 = Gia_ObjFanin1(pGStack_18);
      iVar2 = Abc_MaxInt(uVar1,pGVar4->Value);
      local_24 = iVar2 + 1;
    }
    pGStack_18->Value = local_24;
    local_1c = local_1c + 1;
  }
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = uVar1;
  local_1c = 1;
  while( true ) {
    bVar5 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar5 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar2 = Gia_ObjIsAnd(pGStack_18);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsPi(p,pGStack_18);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsRo(p,pGStack_18);
        if (iVar2 != 0) {
          pGStack_18->Value = s_256Primes[0xfd];
        }
      }
      else {
        pGStack_18->Value = s_256Primes[0xfe];
      }
    }
    else {
      uVar1 = s_256Primes[pGStack_18->Value & 0xff];
      iVar2 = Gia_ObjFaninC0(pGStack_18);
      iVar3 = Gia_ObjFaninC1(pGStack_18);
      pGStack_18->Value = uVar1 + s_256Primes[iVar2 + 0xf5 + iVar3];
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_Iso2ManPrepare( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = Gia_ObjIsAnd(pObj) ? 1 + Abc_MaxInt(Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value) : 0;
    Gia_ManConst0(p)->Value = s_256Primes[ISO_MASK];
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = s_256Primes[pObj->Value & ISO_MASK] + s_256Primes[ISO_MASK - 10 + Gia_ObjFaninC0(pObj) + Gia_ObjFaninC1(pObj)];
        else if ( Gia_ObjIsPi(p, pObj) )
            pObj->Value = s_256Primes[ISO_MASK-1];
        else if ( Gia_ObjIsRo(p, pObj) )
            pObj->Value = s_256Primes[ISO_MASK-2];
}